

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O1

idx_t duckdb::WindowBoundariesState::FindNextStart(ValidityMask *mask,idx_t l,idx_t r,idx_t *n)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t in_RAX;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar5 = *n;
  if (puVar1 == (unsigned_long *)0x0) {
    uVar3 = (l + uVar5) - 1;
    if (r <= uVar3) {
      uVar3 = r;
    }
    iVar4 = 0;
    if (r - l <= uVar5) {
      iVar4 = uVar5 - (r - l);
    }
    *n = iVar4;
    return uVar3;
  }
  while( true ) {
    if (r <= l) {
      return r;
    }
    uVar6 = (ulong)((uint)l & 0x3f);
    uVar3 = puVar1[l >> 6];
    if (uVar3 != 0 || uVar6 != 0) break;
    l = l + 0x40;
    bVar2 = false;
LAB_00cce52a:
    if (bVar2) {
      return in_RAX;
    }
  }
  do {
    if ((uVar3 >> (uVar6 & 0x3f) & 1) != 0) {
      uVar5 = uVar5 - 1;
      *n = uVar5;
      if (uVar5 == 0) {
        in_RAX = r;
        if (l < r) {
          in_RAX = l;
        }
        bVar2 = true;
        goto LAB_00cce52a;
      }
    }
    l = l + 1;
    bVar2 = false;
    if ((0x3e < uVar6) || (uVar6 = uVar6 + 1, r <= l)) goto LAB_00cce52a;
  } while( true );
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}